

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjDecompressToYUVPlanes
              (tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar **dstPlanes,int width,
              int *strides,int height,int flags)

{
  jpeg_component_info *pjVar1;
  int iVar2;
  void *pvVar3;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  JDIMENSION in_R8D;
  long in_R9;
  long *in_FS_OFFSET;
  JDIMENSION in_stack_00000008;
  uint in_stack_00000010;
  int j;
  jpeg_component_info *compptr_1;
  int crow [10];
  JSAMPARRAY yuvptr [10];
  int ih;
  jpeg_component_info *compptr;
  j_decompress_ptr dinfo;
  tjinstance *this;
  my_progress_mgr progress;
  int dctsize;
  JSAMPROW *tmpbuf [10];
  JSAMPROW *outbuf [10];
  JSAMPLE *ptr;
  JSAMPLE *_tmpbuf;
  int th [10];
  int usetmpbuf;
  int tmpbufsize;
  int iw [10];
  int ph [10];
  int pw [10];
  int scaledh;
  int scaledw;
  int jpegSubsamp;
  int jpegheight;
  int jpegwidth;
  int retval;
  int row;
  int sfi;
  int i;
  undefined4 in_stack_fffffffffffffd48;
  JDIMENSION in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  j_decompress_ptr in_stack_fffffffffffffd60;
  int aiStack_298 [2];
  j_decompress_ptr in_stack_fffffffffffffd70;
  long local_268 [10];
  int local_214;
  jpeg_component_info *local_210;
  j_decompress_ptr local_208;
  long local_200;
  jpeg_progress_mgr local_1f8;
  long local_1d8;
  int local_1cc;
  long alStack_1c8 [10];
  long alStack_178 [10];
  void *local_128;
  void *local_120;
  int aiStack_118 [10];
  int local_f0;
  int local_ec;
  int aiStack_e8 [12];
  int aiStack_b8 [12];
  int aiStack_88 [11];
  int local_5c;
  JDIMENSION local_58;
  int local_54;
  JDIMENSION local_50;
  JDIMENSION local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  JDIMENSION local_2c;
  long *local_28;
  
  local_48 = 0;
  local_ec = 0;
  local_f0 = 0;
  local_120 = (void *)0x0;
  local_208 = (j_decompress_ptr)0x0;
  if (in_RDI == 0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"Invalid handle");
    return -1;
  }
  local_208 = (j_decompress_ptr)(in_RDI + 0x208);
  *(undefined4 *)(in_RDI + 0x5f8) = 0;
  *(undefined4 *)(in_RDI + 0x6d0) = 0;
  *(uint *)(in_RDI + 0x5fc) = (uint)((in_stack_00000010 & 0x2000) != 0);
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    alStack_1c8[local_3c] = 0;
    alStack_178[local_3c] = 0;
  }
  local_200 = in_RDI;
  local_2c = in_R8D;
  if ((*(uint *)(in_RDI + 0x600) & 2) == 0) {
    snprintf((char *)(in_RDI + 0x608),200,"%s",
             "tjDecompressToYUVPlanes(): Instance has not been initialized for decompression");
    *(undefined4 *)(local_200 + 0x6d0) = 1;
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
             "tjDecompressToYUVPlanes(): Instance has not been initialized for decompression");
    local_48 = -1;
  }
  else if (((((in_RSI == 0) || (in_RDX == 0)) || (in_RCX == (long *)0x0)) ||
           ((*in_RCX == 0 || ((int)in_R8D < 0)))) || ((int)in_stack_00000008 < 0)) {
    snprintf((char *)(in_RDI + 0x608),200,"%s","tjDecompressToYUVPlanes(): Invalid argument");
    *(undefined4 *)(local_200 + 0x6d0) = 1;
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjDecompressToYUVPlanes(): Invalid argument")
    ;
    local_48 = -1;
  }
  else {
    local_38 = in_R9;
    local_28 = in_RCX;
    if ((in_stack_00000010 & 8) == 0) {
      if ((in_stack_00000010 & 0x10) == 0) {
        if ((in_stack_00000010 & 0x20) != 0) {
          putenv("JSIMD_FORCESSE2=1");
        }
      }
      else {
        putenv("JSIMD_FORCESSE=1");
      }
    }
    else {
      putenv("JSIMD_FORCEMMX=1");
    }
    if ((in_stack_00000010 & 0x8000) == 0) {
      local_208->progress = (jpeg_progress_mgr *)0x0;
    }
    else {
      memset(&local_1f8,0,0x28);
      local_1f8.progress_monitor = my_progress_monitor;
      local_1d8 = local_200;
      local_208->progress = &local_1f8;
    }
    iVar2 = _setjmp((__jmp_buf_tag *)(local_200 + 0x528));
    if (iVar2 == 0) {
      if (*(int *)(local_200 + 0x604) == 0) {
        jpeg_mem_src_tj(in_stack_fffffffffffffd60,
                        (uchar *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                        CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        jpeg_read_header((j_decompress_ptr)
                         CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         in_stack_fffffffffffffd4c);
      }
      *(undefined4 *)(local_200 + 0x604) = 0;
      local_54 = getSubsamp(local_208);
      if (local_54 < 0) {
        snprintf((char *)(local_200 + 0x608),200,"%s",
                 "tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image");
        *(undefined4 *)(local_200 + 0x6d0) = 1;
        snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                 "tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image");
        local_48 = -1;
      }
      else if ((local_54 == 3) || ((local_28[1] != 0 && (local_28[2] != 0)))) {
        local_4c = local_208->image_width;
        local_50 = local_208->image_height;
        if (local_2c == 0) {
          local_2c = local_4c;
        }
        if (in_stack_00000008 == 0) {
          in_stack_00000008 = local_50;
        }
        for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
          local_58 = (int)(local_4c * sf[local_3c].num + sf[local_3c].denom + -1) /
                     sf[local_3c].denom;
          local_5c = (int)(local_50 * sf[local_3c].num + sf[local_3c].denom + -1) /
                     sf[local_3c].denom;
          if (((int)local_58 <= (int)local_2c) && (local_5c <= (int)in_stack_00000008)) break;
        }
        if (local_3c < 0x10) {
          if (local_208->num_components < 4) {
            local_2c = local_58;
            local_208->scale_num = sf[local_3c].num;
            local_208->scale_denom = sf[local_3c].denom;
            local_40 = local_3c;
            jpeg_calc_output_dimensions(in_stack_fffffffffffffd70);
            local_1cc = (sf[local_40].num << 3) / sf[local_40].denom;
            for (local_3c = 0; local_3c < local_208->num_components; local_3c = local_3c + 1) {
              local_210 = local_208->comp_info + local_3c;
              aiStack_e8[local_3c] = local_210->width_in_blocks * local_1cc;
              local_214 = local_210->height_in_blocks * local_1cc;
              iVar2 = tjPlaneWidth((int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                                   (int)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
              aiStack_88[local_3c] = iVar2;
              iVar2 = tjPlaneHeight((int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                                    (int)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
              aiStack_b8[local_3c] = iVar2;
              if ((aiStack_e8[local_3c] != aiStack_88[local_3c]) ||
                 (local_214 != aiStack_b8[local_3c])) {
                local_f0 = 1;
              }
              aiStack_118[local_3c] = local_210->v_samp_factor * local_1cc;
              local_ec = aiStack_e8[local_3c] * aiStack_118[local_3c] + local_ec;
              pvVar3 = malloc((long)aiStack_b8[local_3c] << 3);
              alStack_178[local_3c] = (long)pvVar3;
              if (pvVar3 == (void *)0x0) {
                snprintf((char *)(local_200 + 0x608),200,"%s",
                         "tjDecompressToYUVPlanes(): Memory allocation failure");
                *(undefined4 *)(local_200 + 0x6d0) = 1;
                snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                         "tjDecompressToYUVPlanes(): Memory allocation failure");
                local_48 = -1;
                goto LAB_001142a2;
              }
              local_128 = (void *)local_28[local_3c];
              for (local_44 = 0; local_44 < aiStack_b8[local_3c]; local_44 = local_44 + 1) {
                *(void **)(alStack_178[local_3c] + (long)local_44 * 8) = local_128;
                if ((local_38 == 0) || (*(int *)(local_38 + (long)local_3c * 4) == 0)) {
                  in_stack_fffffffffffffd58 = aiStack_88[local_3c];
                }
                else {
                  in_stack_fffffffffffffd58 = *(int *)(local_38 + (long)local_3c * 4);
                }
                local_128 = (void *)((long)local_128 + (long)in_stack_fffffffffffffd58);
              }
            }
            if (local_f0 != 0) {
              local_120 = malloc((long)local_ec);
              if (local_120 == (void *)0x0) {
                snprintf((char *)(local_200 + 0x608),200,"%s",
                         "tjDecompressToYUVPlanes(): Memory allocation failure");
                *(undefined4 *)(local_200 + 0x6d0) = 1;
                snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                         "tjDecompressToYUVPlanes(): Memory allocation failure");
                local_48 = -1;
                goto LAB_001142a2;
              }
              local_128 = local_120;
              for (local_3c = 0; local_3c < local_208->num_components; local_3c = local_3c + 1) {
                pvVar3 = malloc((long)aiStack_118[local_3c] << 3);
                alStack_1c8[local_3c] = (long)pvVar3;
                if (pvVar3 == (void *)0x0) {
                  snprintf((char *)(local_200 + 0x608),200,"%s",
                           "tjDecompressToYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(local_200 + 0x6d0) = 1;
                  snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                           "tjDecompressToYUVPlanes(): Memory allocation failure");
                  local_48 = -1;
                  goto LAB_001142a2;
                }
                for (local_44 = 0; local_44 < aiStack_118[local_3c]; local_44 = local_44 + 1) {
                  *(void **)(alStack_1c8[local_3c] + (long)local_44 * 8) = local_128;
                  local_128 = (void *)((long)local_128 + (long)aiStack_e8[local_3c]);
                }
              }
            }
            iVar2 = _setjmp((__jmp_buf_tag *)(local_200 + 0x528));
            if (iVar2 == 0) {
              if ((in_stack_00000010 & 0x100) != 0) {
                local_208->do_fancy_upsampling = 0;
              }
              if ((in_stack_00000010 & 0x800) != 0) {
                local_208->dct_method = JDCT_IFAST;
              }
              local_208->raw_data_out = 1;
              jpeg_start_decompress
                        ((j_decompress_ptr)
                         CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
              for (local_44 = 0; local_44 < (int)local_208->output_height;
                  local_44 = local_208->max_v_samp_factor * local_208->min_DCT_scaled_size +
                             local_44) {
                for (local_3c = 0; local_3c < local_208->num_components; local_3c = local_3c + 1) {
                  pjVar1 = local_208->comp_info;
                  if (local_54 == 2) {
                    pjVar1[local_3c].DCT_scaled_size = local_1cc;
                    pjVar1[local_3c].MCU_sample_width =
                         (((sf[local_40].num * 0x10) / sf[local_40].denom) *
                         pjVar1[local_3c].v_samp_factor) / local_208->max_v_samp_factor;
                    local_208->idct->inverse_DCT[local_3c] = local_208->idct->inverse_DCT[0];
                  }
                  aiStack_298[local_3c] =
                       (local_44 * pjVar1[local_3c].v_samp_factor) / local_208->max_v_samp_factor;
                  if (local_f0 == 0) {
                    local_268[local_3c] = alStack_178[local_3c] + (long)aiStack_298[local_3c] * 8;
                  }
                  else {
                    local_268[local_3c] = alStack_1c8[local_3c];
                  }
                }
                jpeg_read_raw_data((j_decompress_ptr)
                                   CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                   (JSAMPIMAGE)
                                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                   in_stack_fffffffffffffd4c);
                if (local_f0 != 0) {
                  for (local_3c = 0; local_3c < local_208->num_components; local_3c = local_3c + 1)
                  {
                    in_stack_fffffffffffffd54 = 0;
                    while( true ) {
                      if (aiStack_118[local_3c] < aiStack_b8[local_3c] - aiStack_298[local_3c]) {
                        in_stack_fffffffffffffd50 = aiStack_118[local_3c];
                      }
                      else {
                        in_stack_fffffffffffffd50 = aiStack_b8[local_3c] - aiStack_298[local_3c];
                      }
                      if (in_stack_fffffffffffffd50 <= in_stack_fffffffffffffd54) break;
                      memcpy(*(void **)(alStack_178[local_3c] +
                                       (long)(aiStack_298[local_3c] + in_stack_fffffffffffffd54) * 8
                                       ),
                             *(void **)(alStack_1c8[local_3c] + (long)in_stack_fffffffffffffd54 * 8)
                             ,(long)aiStack_88[local_3c]);
                      in_stack_fffffffffffffd54 = in_stack_fffffffffffffd54 + 1;
                    }
                    in_stack_fffffffffffffd5c = in_stack_fffffffffffffd54;
                  }
                }
              }
              jpeg_finish_decompress
                        ((j_decompress_ptr)
                         CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
            }
            else {
              local_48 = -1;
            }
          }
          else {
            snprintf((char *)(local_200 + 0x608),200,"%s",
                     "tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components");
            *(undefined4 *)(local_200 + 0x6d0) = 1;
            snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                     "tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components");
            local_48 = -1;
          }
        }
        else {
          snprintf((char *)(local_200 + 0x608),200,"%s",
                   "tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions");
          *(undefined4 *)(local_200 + 0x6d0) = 1;
          snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                   "tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions");
          local_48 = -1;
        }
      }
      else {
        snprintf((char *)(local_200 + 0x608),200,"%s","tjDecompressToYUVPlanes(): Invalid argument")
        ;
        *(undefined4 *)(local_200 + 0x6d0) = 1;
        snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                 "tjDecompressToYUVPlanes(): Invalid argument");
        local_48 = -1;
      }
    }
    else {
      local_48 = -1;
    }
  }
LAB_001142a2:
  if (200 < local_208->global_state) {
    jpeg_abort_decompress((j_decompress_ptr)0x1142c0);
  }
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    free((void *)alStack_1c8[local_3c]);
    free((void *)alStack_178[local_3c]);
  }
  free(local_120);
  if (*(int *)(local_200 + 0x5f8) != 0) {
    local_48 = -1;
  }
  *(undefined4 *)(local_200 + 0x5fc) = 0;
  return local_48;
}

Assistant:

DLLEXPORT int tjDecompressToYUVPlanes(tjhandle handle,
                                      const unsigned char *jpegBuf,
                                      unsigned long jpegSize,
                                      unsigned char **dstPlanes, int width,
                                      int *strides, int height, int flags)
{
  int i, sfi, row, retval = 0;
  int jpegwidth, jpegheight, jpegSubsamp, scaledw, scaledh;
  int pw[MAX_COMPONENTS], ph[MAX_COMPONENTS], iw[MAX_COMPONENTS],
    tmpbufsize = 0, usetmpbuf = 0, th[MAX_COMPONENTS];
  JSAMPLE *_tmpbuf = NULL, *ptr;
  JSAMPROW *outbuf[MAX_COMPONENTS], *tmpbuf[MAX_COMPONENTS];
  int dctsize;
  struct my_progress_mgr progress;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  outbuf[i] = NULL;
  }

  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompressToYUVPlanes(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || !dstPlanes || !dstPlanes[0] ||
      width < 0 || height < 0)
    THROW("tjDecompressToYUVPlanes(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (!this->headerRead) {
    jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
    jpeg_read_header(dinfo, TRUE);
  }
  this->headerRead = 0;
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image");

  if (jpegSubsamp != TJSAMP_GRAY && (!dstPlanes[1] || !dstPlanes[2]))
    THROW("tjDecompressToYUVPlanes(): Invalid argument");

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;
  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions");
  if (dinfo->num_components > 3)
    THROW("tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components");

  width = scaledw;  height = scaledh;
  dinfo->scale_num = sf[i].num;
  dinfo->scale_denom = sf[i].denom;
  sfi = i;
  jpeg_calc_output_dimensions(dinfo);

  dctsize = DCTSIZE * sf[sfi].num / sf[sfi].denom;

  for (i = 0; i < dinfo->num_components; i++) {
    jpeg_component_info *compptr = &dinfo->comp_info[i];
    int ih;

    iw[i] = compptr->width_in_blocks * dctsize;
    ih = compptr->height_in_blocks * dctsize;
    pw[i] = tjPlaneWidth(i, dinfo->output_width, jpegSubsamp);
    ph[i] = tjPlaneHeight(i, dinfo->output_height, jpegSubsamp);
    if (iw[i] != pw[i] || ih != ph[i]) usetmpbuf = 1;
    th[i] = compptr->v_samp_factor * dctsize;
    tmpbufsize += iw[i] * th[i];
    if ((outbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i])) == NULL)
      THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
    ptr = dstPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      outbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }
  if (usetmpbuf) {
    if ((_tmpbuf = (JSAMPLE *)malloc(sizeof(JSAMPLE) * tmpbufsize)) == NULL)
      THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
    ptr = _tmpbuf;
    for (i = 0; i < dinfo->num_components; i++) {
      if ((tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * th[i])) == NULL)
        THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
      for (row = 0; row < th[i]; row++) {
        tmpbuf[i][row] = ptr;
        ptr += iw[i];
      }
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (flags & TJFLAG_FASTUPSAMPLE) dinfo->do_fancy_upsampling = FALSE;
  if (flags & TJFLAG_FASTDCT) dinfo->dct_method = JDCT_FASTEST;
  dinfo->raw_data_out = TRUE;

  jpeg_start_decompress(dinfo);
  for (row = 0; row < (int)dinfo->output_height;
       row += dinfo->max_v_samp_factor * dinfo->_min_DCT_scaled_size) {
    JSAMPARRAY yuvptr[MAX_COMPONENTS];
    int crow[MAX_COMPONENTS];

    for (i = 0; i < dinfo->num_components; i++) {
      jpeg_component_info *compptr = &dinfo->comp_info[i];

      if (jpegSubsamp == TJ_420) {
        /* When 4:2:0 subsampling is used with IDCT scaling, libjpeg will try
           to be clever and use the IDCT to perform upsampling on the U and V
           planes.  For instance, if the output image is to be scaled by 1/2
           relative to the JPEG image, then the scaling factor and upsampling
           effectively cancel each other, so a normal 8x8 IDCT can be used.
           However, this is not desirable when using the decompress-to-YUV
           functionality in TurboJPEG, since we want to output the U and V
           planes in their subsampled form.  Thus, we have to override some
           internal libjpeg parameters to force it to use the "scaled" IDCT
           functions on the U and V planes. */
        compptr->_DCT_scaled_size = dctsize;
        compptr->MCU_sample_width = tjMCUWidth[jpegSubsamp] *
          sf[sfi].num / sf[sfi].denom *
          compptr->v_samp_factor / dinfo->max_v_samp_factor;
        dinfo->idct->inverse_DCT[i] = dinfo->idct->inverse_DCT[0];
      }
      crow[i] = row * compptr->v_samp_factor / dinfo->max_v_samp_factor;
      if (usetmpbuf) yuvptr[i] = tmpbuf[i];
      else yuvptr[i] = &outbuf[i][crow[i]];
    }
    jpeg_read_raw_data(dinfo, yuvptr,
                       dinfo->max_v_samp_factor * dinfo->_min_DCT_scaled_size);
    if (usetmpbuf) {
      int j;

      for (i = 0; i < dinfo->num_components; i++) {
        for (j = 0; j < MIN(th[i], ph[i] - crow[i]); j++) {
          memcpy(outbuf[i][crow[i] + j], tmpbuf[i][j], pw[i]);
        }
      }
    }
  }
  jpeg_finish_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(outbuf[i]);
  }
  free(_tmpbuf);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}